

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
 __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
::insert(QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
         *this,value_type *value)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
  pVar3;
  bool local_59;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_58;
  const_iterator local_50;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_48;
  bool local_39;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_30;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  itr;
  value_type *value_local;
  QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
  *this_local;
  bool local_10;
  
  itr._M_current = value;
  local_30 = QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>::
             find<std::__cxx11::string>
                       ((QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
                         *)this,&value->first);
  local_38._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          ::end(&this->data);
  bVar1 = __gnu_cxx::
          operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
                    (&local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    grow(this);
    local_58._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
            ::end(&this->data);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>const*,std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>>
    ::__normal_iterator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>*>
              ((__normal_iterator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>const*,std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>>
                *)&local_50,&local_58);
    local_48._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
            ::insert(&this->data,local_50,itr._M_current);
    local_59 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
                *)&this_local,&local_48,&local_59);
    uVar2 = extraout_RDX_00;
  }
  else {
    local_39 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
    ::pair<bool,_true>((pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
                        *)&this_local,&local_30,&local_39);
    uVar2 = extraout_RDX;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = local_10;
  pVar3.first._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
        *)this_local;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(value_type &&value) {
      if (const auto itr = find(value.first); itr != data.end()) {
        return std::pair{itr, false};
      } else {
        grow();
        return std::pair{data.insert(data.end(), std::move(value)), true};
      }
    }